

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O3

string * GetSwiftModuleName_abi_cxx11_(string *__return_storage_ptr__,cmGeneratorTarget *target)

{
  pointer pcVar1;
  string *psVar2;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string local_60;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Swift_MODULE_NAME","");
  psVar2 = cmGeneratorTarget::GetName_abi_cxx11_(target);
  pcVar1 = (psVar2->_M_dataplus)._M_p;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + psVar2->_M_string_length);
  psVar2 = GetTargetPropertyOrDefault(__return_storage_ptr__,target,&local_40,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    psVar2 = extraout_RAX;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    psVar2 = extraout_RAX_00;
  }
  return psVar2;
}

Assistant:

static std::string GetSwiftModuleName(cmGeneratorTarget const* target)
{
  return GetTargetPropertyOrDefault(target, "Swift_MODULE_NAME",
                                    target->GetName());
}